

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_> *
ctemplate::GetModifierForHtmlJs
          (vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           *__return_storage_ptr__,HtmlParser *htmlparser,string *error_msg)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  value_type *ppMVar4;
  string attribute_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (htmlparser == (HtmlParser *)0x0) {
    __assert_fail("htmlparser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                  ,0x4c7,
                  "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                 );
  }
  if (error_msg == (string *)0x0) {
    __assert_fail("error_msg",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                  ,0x4c8,
                  "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                 );
  }
  (__return_storage_ptr__->
  super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = ctemplate_htmlparser::HtmlParser::InJavascript(htmlparser);
  if ((bVar1) && (iVar2 = ctemplate_htmlparser::HtmlParser::state(htmlparser), iVar2 != 3)) {
    bVar1 = ctemplate_htmlparser::HtmlParser::IsJavascriptQuoted(htmlparser);
    if (!bVar1) {
      std::
      vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ::push_back(__return_storage_ptr__,(value_type *)(g_am_dirs + 0x20));
      if ((long)(__return_storage_ptr__->
                super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->
                super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                )._M_impl.super__Vector_impl_data._M_start == 8) {
        return __return_storage_ptr__;
      }
      __assert_fail("modvals.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                    ,0x4dc,
                    "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                   );
    }
    std::
    vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
    ::push_back(__return_storage_ptr__,(value_type *)(g_am_dirs + 0x18));
    if ((long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_start == 8) {
      return __return_storage_ptr__;
    }
    __assert_fail("modvals.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                  ,0x4d8,
                  "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                 );
  }
  iVar2 = ctemplate_htmlparser::HtmlParser::state(htmlparser);
  switch(iVar2) {
  case 0:
  case 4:
    bVar1 = ctemplate_htmlparser::HtmlParser::InCss(htmlparser);
    ppMVar4 = (value_type *)(g_am_dirs + 8);
    if (bVar1) {
      ppMVar4 = (value_type *)(g_am_dirs + 0x38);
    }
    std::
    vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
    ::push_back(__return_storage_ptr__,ppMVar4);
    if ((long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_start != 8) {
      __assert_fail("modvals.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                    ,0x54e,
                    "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                   );
    }
    break;
  case 1:
    std::
    vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
    ::push_back(__return_storage_ptr__,(value_type *)(g_am_dirs + 0x10));
    if ((long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_start != 8) {
      __assert_fail("modvals.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                    ,0x53d,
                    "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                   );
    }
    break;
  case 2:
    std::
    vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
    ::push_back(__return_storage_ptr__,(value_type *)(g_am_dirs + 0x10));
    if ((long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_start != 8) {
      __assert_fail("modvals.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                    ,0x544,
                    "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                   );
    }
    break;
  case 3:
    pcVar3 = ctemplate_htmlparser::HtmlParser::attribute(htmlparser);
    std::__cxx11::string::string((string *)&local_38,pcVar3,(allocator *)&bStack_78);
    iVar2 = ctemplate_htmlparser::HtmlParser::AttributeType(htmlparser);
    switch(iVar2) {
    case 0:
      __assert_fail("\"We should be in attribute!\" && 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                    ,0x528,
                    "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                   );
    case 1:
      bVar1 = ctemplate_htmlparser::HtmlParser::IsAttributeQuoted(htmlparser);
      ppMVar4 = (value_type *)(g_am_dirs + (ulong)!bVar1 * 8 + 8);
      break;
    case 2:
      bVar1 = ctemplate_htmlparser::HtmlParser::IsAttributeQuoted(htmlparser);
      if (bVar1) {
        bVar1 = ctemplate_htmlparser::HtmlParser::IsUrlStart(htmlparser);
        ppMVar4 = (value_type *)(g_am_dirs + (ulong)bVar1 * 0x20 + 8);
      }
      else {
        bVar1 = ctemplate_htmlparser::HtmlParser::IsUrlStart(htmlparser);
        if (bVar1) {
          std::operator+(&local_58,"Value of URL attribute \"",&local_38);
          std::operator+(&bStack_78,&local_58,"\" must be enclosed in quotes.");
          std::__cxx11::string::append((string *)error_msg);
          std::__cxx11::string::~string((string *)&bStack_78);
          std::__cxx11::string::~string((string *)&local_58);
          if ((__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_start !=
              (__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("modvals.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                          ,0x4f0,
                          "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                         );
          }
          goto LAB_0012ff95;
        }
        ppMVar4 = (value_type *)(g_am_dirs + 0x30);
      }
      break;
    case 3:
      bVar1 = ctemplate_htmlparser::HtmlParser::IsAttributeQuoted(htmlparser);
      if (bVar1) {
        bVar1 = ctemplate_htmlparser::HtmlParser::IsJavascriptQuoted(htmlparser);
        ppMVar4 = (value_type *)(g_am_dirs + (ulong)!bVar1 * 8 + 0x18);
        break;
      }
      std::operator+(&local_58,"Value of javascript attribute \"",&local_38);
      std::operator+(&bStack_78,&local_58,"\" must be enclosed in quotes.");
      std::__cxx11::string::append((string *)error_msg);
      std::__cxx11::string::~string((string *)&bStack_78);
      std::__cxx11::string::~string((string *)&local_58);
      if ((__return_storage_ptr__->
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (__return_storage_ptr__->
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("modvals.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                      ,0x519,
                      "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                     );
      }
      goto LAB_0012ff95;
    case 4:
      bVar1 = ctemplate_htmlparser::HtmlParser::IsAttributeQuoted(htmlparser);
      if (!bVar1) {
        std::operator+(&local_58,"Value of style attribute \"",&local_38);
        std::operator+(&bStack_78,&local_58,"\" must be enclosed in quotes.");
        std::__cxx11::string::append((string *)error_msg);
        std::__cxx11::string::~string((string *)&bStack_78);
        std::__cxx11::string::~string((string *)&local_58);
        if ((__return_storage_ptr__->
            super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->
            super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("modvals.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                        ,0x50d,
                        "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                       );
        }
        goto LAB_0012ff95;
      }
      ppMVar4 = (value_type *)(g_am_dirs + 0x38);
      break;
    default:
      __assert_fail("\"Should not be able to get here.\" && 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                    ,0x52a,
                    "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                   );
    }
    std::
    vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
    ::push_back(__return_storage_ptr__,ppMVar4);
    ctemplate_htmlparser::HtmlParser::InsertText(htmlparser);
    if ((long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              )._M_impl.super__Vector_impl_data._M_start != 8) {
      __assert_fail("modvals.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                    ,0x536,
                    "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                   );
    }
LAB_0012ff95:
    std::__cxx11::string::~string((string *)&local_38);
    break;
  default:
    __assert_fail("\"Should not be able to get here.\" && 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_modifiers.cc"
                  ,0x552,
                  "vector<const ModifierAndValue *> ctemplate::GetModifierForHtmlJs(HtmlParser *, string *)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

vector<const ModifierAndValue*> GetModifierForHtmlJs(
    HtmlParser* htmlparser, string* error_msg) {
  assert(htmlparser);
  assert(error_msg);
  vector<const ModifierAndValue*> modvals;

  // Two cases of being inside javascript:
  // 1. Inside raw javascript (within a <script> tag). If the value
  //    is quoted we apply javascript_escape, if not we have to coerce
  //    it to a safe value due to the risk of javascript code execution
  //    hence apply :J=number. If arbitrary code needs to be inserted
  //    at run-time, the developer must use :none.
  // 2. In the value of an attribute that takes javascript such
  //    as onmouseevent in '<a href="someUrl" onmousevent="{{EVENT}}">'.
  //    That will be covered in the STATE_VALUE state logic below.
  if (htmlparser->InJavascript() &&
      htmlparser->state() != HtmlParser::STATE_VALUE) {
    if (htmlparser->IsJavascriptQuoted()) {
      modvals.push_back(g_am_dirs[AM_JS]);
      assert(modvals.size() == 1);
      return modvals;
    } else {
      modvals.push_back(g_am_dirs[AM_JS_NUMBER]);
      assert(modvals.size() == 1);
      return modvals;
    }
  }
  switch (htmlparser->state()) {
    case HtmlParser::STATE_VALUE:{
      string attribute_name = htmlparser->attribute();
      switch (htmlparser->AttributeType()) {
        case HtmlParser::ATTR_URI:
          // Case 1: The URL is quoted:
          // . Apply :U=html if it is a complete URL or :h if it is a fragment.
          // Case 2: The URL is not quoted:
          // .  If it is a complete URL, we have no safe modifiers that
          //   won't break it so we have to fail.
          // .  If it is a URL fragment, then :u is safe and not likely to
          //   break the URL.
          if (!htmlparser->IsAttributeQuoted()) {
            if (htmlparser->IsUrlStart()) {   // Complete URL.
              error_msg->append("Value of URL attribute \"" + attribute_name +
                                "\" must be enclosed in quotes.");
              assert(modvals.empty());
              return modvals;  // Empty
            } else {                                // URL fragment.
              modvals.push_back(g_am_dirs[AM_URL_QUERY]);
            }
          } else {
            // Only validate the URL if we have a complete URL,
            // otherwise simply html_escape.
            if (htmlparser->IsUrlStart())
              modvals.push_back(g_am_dirs[AM_URL_HTML]);
            else
              modvals.push_back(g_am_dirs[AM_HTML]);
          }
          break;
        case HtmlParser::ATTR_REGULAR:
          // If the value is quoted, simply HTML escape, otherwise
          // apply stricter escaping using H=attribute.
          if (htmlparser->IsAttributeQuoted())
            modvals.push_back(g_am_dirs[AM_HTML]);
          else
            modvals.push_back(g_am_dirs[AM_HTML_UNQUOTED]);
          break;
        case HtmlParser::ATTR_STYLE:
          // If the value is quoted apply :c, otherwise fail.
          if (htmlparser->IsAttributeQuoted()) {
            modvals.push_back(g_am_dirs[AM_STYLE]);
          } else {
            error_msg->append("Value of style attribute \"" + attribute_name +
                              "\" must be enclosed in quotes.");
            assert(modvals.empty());
            return modvals;   // Empty
          }
          break;
        case HtmlParser::ATTR_JS:
          // We require javascript accepting attributes (such as onclick)
          // to be HTML quoted, otherwise they are vulnerable to
          // HTML attribute insertion via the use of whitespace.
          if (!htmlparser->IsAttributeQuoted()) {
            error_msg->append("Value of javascript attribute \"" +
                              attribute_name +
                              "\" must be enclosed in quotes.");
            assert(modvals.empty());
            return modvals;   // Empty
          }
          // If the variable is quoted apply javascript_escape otherwise
          // apply javascript_number which will ensure it is safe against
          // code injection.
          // Note: We normally need to HTML escape after javascript escape
          // but the javascript escape implementation provided makes the
          // HTML escape redundant so simply javascript escape.
          if (htmlparser->IsJavascriptQuoted())
            modvals.push_back(g_am_dirs[AM_JS]);
          else
            modvals.push_back(g_am_dirs[AM_JS_NUMBER]);
          break;
        case HtmlParser::ATTR_NONE:
          assert("We should be in attribute!" && 0);
        default:
          assert("Should not be able to get here." && 0);
          return modvals;  // Empty
      }
      // In STATE_VALUE particularly, the parser may get out of sync with
      // the correct state - that the browser sees - due to the fact that
      // it does not get to parse run-time content (variables). So we tell
      // the parser there is content that will be expanded here.
      // A good example is:
      //   <a href={{URL}} alt={{NAME}}>
      // The parser sees <a href= alt=> and interprets 'alt=' to be
      // the value of href.
      htmlparser->InsertText();  // Ignore return value.
      assert(modvals.size() == 1);
      return modvals;
    }
    case HtmlParser::STATE_TAG:{
      // Apply H=attribute to tag names since they are alphabetic.
      // Examples of tag names: TITLE, BODY, A and BR.
      modvals.push_back(g_am_dirs[AM_HTML_UNQUOTED]);
      assert(modvals.size() == 1);
      return modvals;
    }
    case HtmlParser::STATE_ATTR:{
      // Apply H=attribute to attribute names since they are alphabetic.
      // Examples of attribute names: HREF, SRC and WIDTH.
      modvals.push_back(g_am_dirs[AM_HTML_UNQUOTED]);
      assert(modvals.size() == 1);
      return modvals;
    }
    case HtmlParser::STATE_COMMENT:
    case HtmlParser::STATE_TEXT:{
      // Apply :h to regular HTML text and :c if within a style tag.
      if (htmlparser->InCss())
        modvals.push_back(g_am_dirs[AM_STYLE]);
      else
        modvals.push_back(g_am_dirs[AM_HTML]);
      assert(modvals.size() == 1);
      return modvals;
    }
    default:{
      assert("Should not be able to get here." && 0);
      return modvals;   // Empty
    }
  }
  assert("Should not be able to get here." && 0);
  return modvals;   // Empty
}